

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.h
# Opt level: O0

void __thiscall
Init::TextDocumentSyncOptions::TextDocumentSyncOptions(TextDocumentSyncOptions *this)

{
  TextDocumentSyncOptions *this_local;
  
  Reflectable::Reflectable(&this->super_Reflectable);
  (this->super_Reflectable)._vptr_Reflectable = (_func_int **)&PTR_reflect_002cd620;
  this->openClose = false;
  this->change = None;
  this->willSave = false;
  this->willSaveWaitUntil = false;
  optional<Init::SaveOptions>::optional(&this->save);
  return;
}

Assistant:

void reflect (StringWriter &writer) override {
            writer.StartObject();
            reflectBool(writer, "openClose", openClose);
            reflectInt(writer, "change", (int) change);
            reflectBool(writer, "willSave", willSave);
            reflectBool(writer, "willSaveWaitUntil", willSaveWaitUntil);
            reflectOptionalObject(writer, "save", save);
            writer.EndObject();
        }